

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

NJDNode * NJDNode_insert(NJDNode *prev,NJDNode *next,NJDNode *node)

{
  NJDNode *in_RDX;
  _NJDNode *in_RSI;
  _NJDNode *in_RDI;
  NJDNode *tail;
  NJDNode *local_20;
  
  if ((in_RDI != (_NJDNode *)0x0) && (local_20 = in_RDX, in_RSI != (_NJDNode *)0x0)) {
    for (; local_20->next != (_NJDNode *)0x0; local_20 = local_20->next) {
    }
    in_RDI->next = in_RDX;
    in_RDX->prev = in_RDI;
    in_RSI->prev = local_20;
    local_20->next = in_RSI;
    return local_20;
  }
  fprintf(_stderr,"ERROR: NJDNode_insert() in njd_node.c: NJDNodes are not specified.\n");
  exit(1);
}

Assistant:

NJDNode *NJDNode_insert(NJDNode * prev, NJDNode * next, NJDNode * node)
{
   NJDNode *tail;

   if (prev == NULL || next == NULL) {
      fprintf(stderr, "ERROR: NJDNode_insert() in njd_node.c: NJDNodes are not specified.\n");
      exit(1);
   }
   for (tail = node; tail->next != NULL; tail = tail->next);
   prev->next = node;
   node->prev = prev;
   next->prev = tail;
   tail->next = next;

   return tail;
}